

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O1

void stressing_multi_threads(int threadNum)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__dest;
  Thread *this;
  int iVar1;
  long lVar2;
  string local_b8;
  undefined1 auStack_98 [8];
  vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> vsp;
  undefined1 local_78 [8];
  shared_ptr<Thread> tmp;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"----------stressing test multi thread-----------",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  auStack_98 = (undefined1  [8])0x0;
  vsp.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  vsp.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < threadNum) {
    iVar1 = threadNum;
    do {
      this = (Thread *)operator_new(200);
      tmp.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)threadFunc;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testFunc","");
      Thread::Thread(this,(ThreadFunc *)
                          &tmp.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     &local_b8);
      local_78 = (undefined1  [8])this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Thread*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tmp,this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      __dest = &tmp.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::_Function_handler<void_(),_void_(*)()>::_M_manager
                ((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
      std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::push_back
                ((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> *)
                 auStack_98,(value_type *)local_78);
      if (tmp.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   tmp.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  if (0 < threadNum) {
    lVar2 = 0;
    do {
      Thread::start(*(Thread **)
                     ((long)&((__shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2> *)auStack_98)->
                             _M_ptr + lVar2));
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)threadNum << 4 != lVar2);
  }
  sleep(3);
  std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::~vector
            ((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> *)
             auStack_98);
  return;
}

Assistant:

void stressing_multi_threads(int threadNum = 4)
{
    // threadNum * 100000 lines
    cout << "----------stressing test multi thread-----------" << endl;
    vector<shared_ptr<Thread>> vsp;
    for (int i = 0; i < threadNum; ++i)
    {
        shared_ptr<Thread> tmp(new Thread(threadFunc, "testFunc"));
        vsp.push_back(tmp);
    }
    for (int i = 0; i < threadNum; ++i)
    {
        vsp[i]->start();
    }
    sleep(3);
}